

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  bool bVar4;
  uint local_250;
  uint local_24c;
  uint32_t bits_1;
  uint32_t reps;
  int skip_preamble;
  uint32_t code;
  uint8_t *context_map;
  uint32_t max_run_length_prefix;
  uint32_t context_index;
  uint32_t alphabet_size;
  uint32_t bits;
  BrotliMetablockHeaderArena *h;
  BrotliBitReader *pBStack_218;
  BrotliDecoderErrorCode result;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  uint8_t **context_map_arg_local;
  uint32_t *num_htrees_local;
  uint32_t context_map_size_local;
  undefined4 local_1e4;
  BrotliBitReader *local_1e0;
  int local_1d4;
  uint *local_1d0;
  uint32_t local_1c4;
  BrotliBitReader *local_1c0;
  int local_1b4;
  BrotliBitReader *local_1b0;
  BrotliBitReader *local_1a8;
  uint *local_1a0;
  uint32_t local_194;
  BrotliBitReader *local_190;
  uint32_t local_188;
  uint local_184;
  uint *local_180;
  undefined4 local_174;
  BrotliBitReader *local_170;
  undefined4 local_168;
  uint32_t local_164;
  BrotliBitReader *local_160;
  BrotliBitReader *local_158;
  undefined4 local_14c;
  BrotliBitReader *local_148;
  uint32_t local_13c;
  BrotliBitReader *local_138;
  undefined4 local_12c;
  BrotliBitReader *local_128;
  undefined4 local_11c;
  BrotliBitReader *local_118;
  BrotliBitReader *local_110;
  uint local_104;
  BrotliBitReader *local_100;
  uint local_f4;
  uint32_t *local_f0;
  undefined4 local_e4;
  BrotliBitReader *local_e0;
  int local_d4;
  undefined4 local_d0;
  uint32_t local_cc;
  BrotliBitReader *local_c8;
  BrotliBitReader *local_c0;
  BrotliBitReader *local_b8;
  uint local_b0;
  uint local_ac;
  uint32_t *puStack_a8;
  uint32_t val;
  BrotliBitReader *local_a0;
  HuffmanCode *local_98;
  int local_8c;
  uint *local_88;
  undefined4 local_7c;
  BrotliBitReader *local_78;
  int local_6c;
  undefined4 local_68;
  uint32_t local_64;
  BrotliBitReader *local_60;
  BrotliBitReader *local_58;
  BrotliBitReader *local_50;
  uint local_48;
  uint local_44;
  BrotliBitReader *pBStack_40;
  uint32_t nbits;
  HuffmanCode *local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  BrotliBitReader *local_20;
  undefined4 local_14;
  BrotliBitReader *local_10;
  
  pBStack_218 = &s->br;
  h._4_4_ = BROTLI_DECODER_SUCCESS;
  _alphabet_size = &s->arena;
  br = (BrotliBitReader *)s;
  s_local = (BrotliDecoderStateInternal *)context_map_arg;
  context_map_arg_local = (uint8_t **)num_htrees;
  num_htrees_local._0_4_ = context_map_size;
  switch((s->arena).header.substate_context_map) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    h._4_4_ = DecodeVarLenUint8(s,pBStack_218,num_htrees);
    if (h._4_4_ != BROTLI_DECODER_SUCCESS) {
      return h._4_4_;
    }
    *(int *)context_map_arg_local = *(int *)context_map_arg_local + 1;
    (_alphabet_size->header).context_index = 0;
    uVar2 = (**(code **)&br[1].bit_pos_)(br[1].avail_in);
    s_local->state = (int)uVar2;
    s_local->loop_counter = (int)((ulong)uVar2 >> 0x20);
    lVar1._0_4_ = s_local->state;
    lVar1._4_4_ = s_local->loop_counter;
    if (lVar1 == 0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*(uint *)context_map_arg_local < 2) {
      memset(*(void **)s_local,0,(ulong)(uint32_t)num_htrees_local);
      return BROTLI_DECODER_SUCCESS;
    }
    (_alphabet_size->header).substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    local_e0 = pBStack_218;
    local_e4 = 5;
    local_f0 = &context_index;
    do {
      local_c8 = pBStack_218;
      if (4 < 0x40 - pBStack_218->bit_pos_) {
        local_c0 = pBStack_218;
        local_d0 = 5;
        local_cc = 0x1f;
        context_index = (uint)(pBStack_218->val_ >> ((byte)pBStack_218->bit_pos_ & 0x3f)) & 0x1f;
        local_d4 = 1;
        goto LAB_001b60ed;
      }
      local_b8 = pBStack_218;
      bVar4 = pBStack_218->avail_in != 0;
      if (bVar4) {
        pBStack_218->val_ = pBStack_218->val_ >> 8;
        pBStack_218->val_ = (ulong)*pBStack_218->next_in << 0x38 | pBStack_218->val_;
        pBStack_218->bit_pos_ = pBStack_218->bit_pos_ - 8;
        pBStack_218->avail_in = pBStack_218->avail_in - 1;
        pBStack_218->next_in = pBStack_218->next_in + 1;
      }
      local_b0 = (uint)bVar4;
    } while (local_b0 != 0);
    local_d4 = 0;
LAB_001b60ed:
    if (local_d4 == 0) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if ((context_index & 1) == 0) {
      (_alphabet_size->header).max_run_length_prefix = 0;
      local_128 = pBStack_218;
      local_12c = 1;
      pBStack_218->bit_pos_ = pBStack_218->bit_pos_ + 1;
    }
    else {
      (_alphabet_size->header).max_run_length_prefix = (context_index >> 1) + 1;
      local_118 = pBStack_218;
      local_11c = 5;
      pBStack_218->bit_pos_ = pBStack_218->bit_pos_ + 5;
    }
    (_alphabet_size->header).substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    max_run_length_prefix =
         *(int *)context_map_arg_local + (_alphabet_size->header).max_run_length_prefix;
    num_htrees_local._4_4_ =
         ReadHuffmanCode(max_run_length_prefix,max_run_length_prefix,
                         (_alphabet_size->header).context_map_table,(uint32_t *)0x0,
                         (BrotliDecoderStateInternal *)br);
    if (num_htrees_local._4_4_ == BROTLI_DECODER_SUCCESS) {
      (_alphabet_size->header).code = 0xffff;
      (_alphabet_size->header).substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
switchD_001b5e96_caseD_3:
      h._4_4_ = BROTLI_DECODER_SUCCESS;
      context_map._0_4_ = (_alphabet_size->header).max_run_length_prefix;
      skip_preamble = s_local->state;
      unique0x00012004 = s_local->loop_counter;
      reps = (_alphabet_size->header).code;
      bits_1 = (uint32_t)(reps != 0xffff);
      context_map._4_4_ = (_alphabet_size->header).context_index;
      while (context_map._4_4_ < (uint32_t)num_htrees_local || bits_1 != 0) {
        if (bits_1 == 0) {
          local_98 = (_alphabet_size->header).context_map_table;
          local_a0 = pBStack_218;
          puStack_a8 = &reps;
          local_78 = pBStack_218;
          local_7c = 0xf;
          local_88 = &local_ac;
          do {
            local_60 = pBStack_218;
            if (0xe < 0x40 - pBStack_218->bit_pos_) {
              local_58 = pBStack_218;
              local_68 = 0xf;
              local_64 = 0x7fff;
              local_ac = (uint)(pBStack_218->val_ >> ((byte)pBStack_218->bit_pos_ & 0x3f)) & 0x7fff;
              local_6c = 1;
              goto LAB_001b6410;
            }
            local_50 = pBStack_218;
            bVar4 = pBStack_218->avail_in != 0;
            if (bVar4) {
              pBStack_218->val_ = pBStack_218->val_ >> 8;
              pBStack_218->val_ = (ulong)*pBStack_218->next_in << 0x38 | pBStack_218->val_;
              pBStack_218->bit_pos_ = pBStack_218->bit_pos_ - 8;
              pBStack_218->avail_in = pBStack_218->avail_in - 1;
              pBStack_218->next_in = pBStack_218->next_in + 1;
            }
            local_48 = (uint)bVar4;
          } while (local_48 != 0);
          local_6c = 0;
LAB_001b6410:
          if (local_6c == 0) {
            local_8c = SafeDecodeSymbol(local_98,pBStack_218,puStack_a8);
          }
          else {
            local_30 = local_ac;
            pBStack_40 = pBStack_218;
            local_38 = local_98 + (local_ac & 0xff);
            if (8 < local_38->bits) {
              local_44 = local_38->bits - 8;
              local_10 = pBStack_218;
              local_14 = 8;
              pBStack_218->bit_pos_ = pBStack_218->bit_pos_ + 8;
              local_28 = kBitMask[local_44];
              local_38 = local_38 + ((uint)local_38->value + (local_ac >> 8 & local_28));
              local_2c = local_44;
            }
            local_20 = pBStack_218;
            local_24 = (uint)local_38->bits;
            pBStack_218->bit_pos_ = local_24 + pBStack_218->bit_pos_;
            reps = (uint32_t)local_38->value;
            local_8c = 1;
          }
          if (local_8c == 0) {
            (_alphabet_size->header).code = 0xffff;
            (_alphabet_size->header).context_index = context_map._4_4_;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (reps == 0) {
            *(undefined1 *)(_skip_preamble + (ulong)context_map._4_4_) = 0;
            context_map._4_4_ = context_map._4_4_ + 1;
          }
          else {
            if (reps <= (uint32_t)context_map) goto LAB_001b65f0;
            *(char *)(_skip_preamble + (ulong)context_map._4_4_) =
                 (char)reps - (char)(uint32_t)context_map;
            context_map._4_4_ = context_map._4_4_ + 1;
          }
        }
        else {
          bits_1 = 0;
LAB_001b65f0:
          local_1c0 = pBStack_218;
          local_1c4 = reps;
          local_1d0 = &local_24c;
          do {
            local_1b0 = pBStack_218;
            if (reps <= 0x40 - pBStack_218->bit_pos_) {
              local_190 = pBStack_218;
              local_194 = reps;
              local_158 = pBStack_218;
              local_188 = reps;
              local_184 = kBitMask[reps];
              local_24c = (uint)(pBStack_218->val_ >> ((byte)pBStack_218->bit_pos_ & 0x3f)) &
                          local_184;
              local_138 = pBStack_218;
              local_13c = reps;
              pBStack_218->bit_pos_ = reps + pBStack_218->bit_pos_;
              local_1b4 = 1;
              local_1a0 = local_1d0;
              goto LAB_001b67bb;
            }
            local_110 = pBStack_218;
            bVar4 = pBStack_218->avail_in != 0;
            if (bVar4) {
              pBStack_218->val_ = pBStack_218->val_ >> 8;
              pBStack_218->val_ = (ulong)*pBStack_218->next_in << 0x38 | pBStack_218->val_;
              pBStack_218->bit_pos_ = pBStack_218->bit_pos_ - 8;
              pBStack_218->avail_in = pBStack_218->avail_in - 1;
              pBStack_218->next_in = pBStack_218->next_in + 1;
            }
            local_104 = (uint)bVar4;
          } while (local_104 != 0);
          local_1b4 = 0;
LAB_001b67bb:
          if (local_1b4 == 0) {
            (_alphabet_size->header).code = reps;
            (_alphabet_size->header).context_index = context_map._4_4_;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          local_24c = (1 << ((byte)reps & 0x1f)) + local_24c;
          if ((uint32_t)num_htrees_local < context_map._4_4_ + local_24c) {
            return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
          }
          do {
            uVar3 = context_map._4_4_ + 1;
            *(undefined1 *)(_skip_preamble + (ulong)context_map._4_4_) = 0;
            local_24c = local_24c - 1;
            context_map._4_4_ = uVar3;
          } while (local_24c != 0);
          local_24c = 0;
        }
      }
      goto switchD_001b5e96_caseD_4;
    }
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    goto switchD_001b5e96_caseD_3;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
switchD_001b5e96_caseD_4:
    local_1e0 = pBStack_218;
    local_1e4 = 1;
    _context_map_size_local = &local_250;
    do {
      local_1a8 = pBStack_218;
      if (pBStack_218->bit_pos_ != 0x40) {
        local_170 = pBStack_218;
        local_174 = 1;
        local_160 = pBStack_218;
        local_168 = 1;
        local_164 = 1;
        local_250 = (uint)(pBStack_218->val_ >> ((byte)pBStack_218->bit_pos_ & 0x3f)) & 1;
        local_148 = pBStack_218;
        local_14c = 1;
        pBStack_218->bit_pos_ = pBStack_218->bit_pos_ + 1;
        local_1d4 = 1;
        local_180 = _context_map_size_local;
        goto LAB_001b6a39;
      }
      local_100 = pBStack_218;
      bVar4 = pBStack_218->avail_in != 0;
      if (bVar4) {
        pBStack_218->val_ = pBStack_218->val_ >> 8;
        pBStack_218->val_ = (ulong)*pBStack_218->next_in << 0x38 | pBStack_218->val_;
        pBStack_218->bit_pos_ = pBStack_218->bit_pos_ - 8;
        pBStack_218->avail_in = pBStack_218->avail_in - 1;
        pBStack_218->next_in = pBStack_218->next_in + 1;
      }
      local_f4 = (uint)bVar4;
    } while (local_f4 != 0);
    local_1d4 = 0;
LAB_001b6a39:
    if (local_1d4 == 0) {
      (_alphabet_size->header).substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
      num_htrees_local._4_4_ = BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    else {
      if (local_250 != 0) {
        InverseMoveToFrontTransform
                  (*(uint8_t **)s_local,(uint32_t)num_htrees_local,(BrotliDecoderStateInternal *)br)
        ;
      }
      (_alphabet_size->header).substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      num_htrees_local._4_4_ = BROTLI_DECODER_SUCCESS;
    }
    break;
  default:
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  return num_htrees_local._4_4_;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliMetablockHeaderArena* h = &s->arena.header;

  switch ((int)h->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      h->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg =
          (uint8_t*)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        h->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        h->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(h->max_run_length_prefix);
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
      uint32_t alphabet_size = *num_htrees + h->max_run_length_prefix;
      result = ReadHuffmanCode(alphabet_size, alphabet_size,
                               h->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      h->code = 0xFFFF;
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = h->context_index;
      uint32_t max_run_length_prefix = h->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = h->code;
      BROTLI_BOOL skip_preamble = (code != 0xFFFF);
      while (context_index < context_map_size || skip_preamble) {
        if (!skip_preamble) {
          if (!SafeReadSymbol(h->context_map_table, br, &code)) {
            h->code = 0xFFFF;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          BROTLI_LOG_UINT(code);

          if (code == 0) {
            context_map[context_index++] = 0;
            continue;
          }
          if (code > max_run_length_prefix) {
            context_map[context_index++] =
                (uint8_t)(code - max_run_length_prefix);
            continue;
          }
        } else {
          skip_preamble = BROTLI_FALSE;
        }
        /* RLE sub-stage. */
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            h->code = code;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}